

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O2

void print_tcp(void *data)

{
  char *pcVar1;
  
  if (*data != 0) {
    print_port("sport",(uint16_t *)data,*(byte *)((long)data + 0xb) & 1);
  }
  if (*(short *)((long)data + 4) != 0) {
    print_port("dport",(uint16_t *)((long)data + 4),*(byte *)((long)data + 0xb) & 2);
  }
  if (*(char *)((long)data + 10) == '\0') {
    if ((*(byte *)((long)data + 0xb) & 8) == 0) {
      return;
    }
    pcVar1 = " !";
  }
  else {
    pcVar1 = " !";
    if ((*(byte *)((long)data + 0xb) & 8) == 0) {
      pcVar1 = "";
    }
  }
  printf("%s --tcp-flags",pcVar1);
  print_tcp_flag((uint)*(byte *)((long)data + 10));
  print_tcp_flag((uint)*(byte *)((long)data + 9));
  return;
}

Assistant:

static void print_tcp(void *data)
{
	match_tcp_t *m = (match_tcp_t *)data;

	if (m->src[0]) {
		print_port("sport", m->src, m->invert & INV_TCP_SRC);
	}

	if (m->dst[0]) {
		print_port("dport", m->dst, m->invert & INV_TCP_DST);
	}

	if (m->flag_mask || m->invert & INV_TCP_FLAG) {
		printf("%s --tcp-flags", m->invert & INV_TCP_FLAG ? " !" : "");
		print_tcp_flag(m->flag_mask);
		print_tcp_flag(m->flag);
	}
}